

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_arith_decode_advance(stb_arith *a,uint totalfreq,uint freq,uint cumfreq)

{
  uint uVar1;
  uint freqsize;
  uint cumfreq_local;
  uint freq_local;
  uint totalfreq_local;
  stb_arith *a_local;
  
  uVar1 = a->range / totalfreq;
  a->code = a->code - uVar1 * cumfreq;
  a->range = uVar1 * freq;
  while (a->range < 0x1000000) {
    stb__renorm_decoder(a);
  }
  return;
}

Assistant:

void stb_arith_decode_advance(stb_arith *a, unsigned int totalfreq, unsigned int freq, unsigned int cumfreq)
{
   unsigned int freqsize = a->range / totalfreq; // @OPTIMIZE, share with above divide somehow?
   a->code -= freqsize * cumfreq;
   a->range = freqsize * freq;
   while (a->range < 0x1000000)
      stb__renorm_decoder(a);
}